

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O2

ON_DimStyle * __thiscall
ON_DimStyle::CreateOverrideCandidate(ON_DimStyle *__return_storage_ptr__,ON_DimStyle *this)

{
  ON_UUID parent_id_00;
  bool bVar1;
  ON_UUID *pOVar2;
  ON_DimStyle *parent;
  uchar extraout_RDX [8];
  ON_UUID id;
  ON_UUID parent_id;
  ON_DimStyle *local_28;
  uchar auStack_20 [8];
  
  ON_DimStyle(__return_storage_ptr__,this);
  pOVar2 = ON_ModelComponent::ParentId(&this->super_ON_ModelComponent);
  bVar1 = IsOverrideDimStyleCandidate(this,*pOVar2,false,(ON_wString *)0x0);
  if (!bVar1) {
    bVar1 = ON_ModelComponent::ParentIdIsNotNil(&__return_storage_ptr__->super_ON_ModelComponent);
    if (bVar1) {
      pOVar2 = ON_ModelComponent::ParentId(&__return_storage_ptr__->super_ON_ModelComponent);
    }
    else {
      pOVar2 = ON_ModelComponent::Id(&__return_storage_ptr__->super_ON_ModelComponent);
    }
    local_28 = *(ON_DimStyle **)pOVar2;
    auStack_20 = *&pOVar2->Data4;
    ON_ModelComponent::ClearId(&__return_storage_ptr__->super_ON_ModelComponent);
    ON_ModelComponent::ClearName(&__return_storage_ptr__->super_ON_ModelComponent);
    ON_ModelComponent::ClearIndex(&__return_storage_ptr__->super_ON_ModelComponent);
    bVar1 = ::operator==(&ON_nil_uuid,(ON_UUID_struct *)&local_28);
    if (bVar1) {
      pOVar2 = ON_ModelComponent::Id(&Default.super_ON_ModelComponent);
      local_28 = *(ON_DimStyle **)pOVar2;
      auStack_20 = *&pOVar2->Data4;
    }
    ON_ModelComponent::SetParentId
              (&__return_storage_ptr__->super_ON_ModelComponent,(ON_UUID *)&local_28);
    if (__return_storage_ptr__->m_field_override_parent_count != 0) {
      id.Data4[0] = extraout_RDX[0];
      id.Data4[1] = extraout_RDX[1];
      id.Data4[2] = extraout_RDX[2];
      id.Data4[3] = extraout_RDX[3];
      id.Data4[4] = extraout_RDX[4];
      id.Data4[5] = extraout_RDX[5];
      id.Data4[6] = extraout_RDX[6];
      id.Data4[7] = extraout_RDX[7];
      id._0_8_ = auStack_20;
      parent = SystemDimstyleFromId(local_28,id);
      pOVar2 = ON_ModelComponent::Id(&parent->super_ON_ModelComponent);
      bVar1 = ::operator==(pOVar2,(ON_UUID_struct *)&local_28);
      if (bVar1) {
        OverrideFields(__return_storage_ptr__,__return_storage_ptr__,parent);
      }
    }
    parent_id_00.Data4[0] = auStack_20[0];
    parent_id_00.Data4[1] = auStack_20[1];
    parent_id_00.Data4[2] = auStack_20[2];
    parent_id_00.Data4[3] = auStack_20[3];
    parent_id_00.Data4[4] = auStack_20[4];
    parent_id_00.Data4[5] = auStack_20[5];
    parent_id_00.Data4[6] = auStack_20[6];
    parent_id_00.Data4[7] = auStack_20[7];
    parent_id_00._0_8_ = local_28;
    bVar1 = IsOverrideDimStyleCandidate(__return_storage_ptr__,parent_id_00,false,(ON_wString *)0x0)
    ;
    if (!bVar1) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_dimensionstyle.cpp"
                 ,0x14fa,"","Failed to create valid override candidate.");
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_DimStyle ON_DimStyle::CreateOverrideCandidate() const
{
  ON_DimStyle override_candidate(*this);
  
  // NOTE:
  // parent_id can be nil. This allows a default constructed dimstyle to be
  // used as an override candidate.
  if ( this->IsOverrideDimStyleCandidate(ParentId(), false))
    return override_candidate;

  ON_UUID parent_id
    = override_candidate.ParentIdIsNotNil()
    ? override_candidate.ParentId()
    : override_candidate.Id();

  override_candidate.ClearId();
  override_candidate.ClearName();
  override_candidate.ClearIndex();

  if (ON_nil_uuid == parent_id)
  {
    parent_id = ON_DimStyle::Default.Id();
  }
  
  override_candidate.SetParentId(parent_id);

  if (override_candidate.HasOverrides())
  {
    const ON_DimStyle& system_parent = ON_DimStyle::SystemDimstyleFromId(parent_id);
    if (system_parent.Id() == parent_id)
      override_candidate.OverrideFields(override_candidate, system_parent);
  }

  if (false == override_candidate.IsOverrideDimStyleCandidate(parent_id, false))
  {
    ON_ERROR("Failed to create valid override candidate.");
  }

  return override_candidate;  
}